

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O2

void __thiscall IDLExport::closeNamespaces(IDLExport *this,ostream *stream,int levels)

{
  string *this_00;
  ostream *poVar1;
  bool bVar2;
  string local_50 [32];
  
  if (levels < 1) {
    levels = 0;
  }
  this_00 = &this->m_indent;
  while (bVar2 = levels != 0, levels = levels + -1, bVar2) {
    std::__cxx11::string::string(local_50,(string *)this_00,0,(this->m_indent)._M_string_length - 4)
    ;
    std::__cxx11::string::operator=((string *)this_00,local_50);
    std::__cxx11::string::~string(local_50);
    poVar1 = std::operator<<(stream,"\n");
    poVar1 = std::operator<<(poVar1,(string *)this_00);
    std::operator<<(poVar1,"};\n");
  }
  return;
}

Assistant:

void IDLExport::closeNamespaces(ostream& stream, int levels)
{
    for (int i = 0; i < levels; ++i)
    {
        m_indent = std::string(m_indent, 0, m_indent.size() - 4);
        stream << "\n" << m_indent << "};\n";
    }
}